

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiStorage::SetVoidPtr(ImGuiStorage *this,ImGuiID key,void *val)

{
  const_iterator it_00;
  iterator pvVar1;
  iterator pvVar2;
  Pair local_38;
  const_iterator local_28;
  iterator it;
  void *val_local;
  ImGuiStorage *pIStack_10;
  ImGuiID key_local;
  ImGuiStorage *this_local;
  
  it = (iterator)val;
  val_local._4_4_ = key;
  pIStack_10 = this;
  pvVar1 = LowerBound(&this->Data,key);
  local_28 = pvVar1;
  pvVar2 = ImVector<ImGuiStorage::Pair>::end(&this->Data);
  it_00 = local_28;
  if ((pvVar1 == pvVar2) || (local_28->key != val_local._4_4_)) {
    Pair::Pair(&local_38,val_local._4_4_,it);
    ImVector<ImGuiStorage::Pair>::insert(&this->Data,it_00,&local_38);
  }
  else {
    (local_28->field_1).val_p = it;
  }
  return;
}

Assistant:

void ImGuiStorage::SetVoidPtr(ImGuiID key, void* val)
{
    ImVector<Pair>::iterator it = LowerBound(Data, key);
    if (it == Data.end() || it->key != key)
    {
        Data.insert(it, Pair(key, val));
        return;
    }
    it->val_p = val;
}